

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O1

int mem_gets(BIO *bio,char *buf,int size)

{
  ulong uVar1;
  void *__s;
  uint outl;
  uint uVar2;
  void *pvVar3;
  
  BIO_clear_retry_flags(bio);
  if (size < 1) {
    uVar2 = 0;
  }
  else {
    uVar1 = *bio->ptr;
    __s = *(void **)((long)bio->ptr + 8);
    uVar2 = (uint)uVar1;
    if (size - 1U <= uVar1) {
      uVar2 = size - 1U;
    }
    if (uVar2 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = memchr(__s,10,(ulong)uVar2);
    }
    outl = ((int)pvVar3 - (int)__s) + 1;
    if (pvVar3 == (void *)0x0) {
      outl = uVar2;
    }
    uVar2 = mem_read(bio,buf,outl);
    if (-1 < (int)uVar2) {
      buf[uVar2] = '\0';
    }
  }
  return uVar2;
}

Assistant:

static int mem_gets(BIO *bio, char *buf, int size) {
  BIO_clear_retry_flags(bio);
  if (size <= 0) {
    return 0;
  }

  // The buffer size includes space for the trailing NUL, so we can read at most
  // one fewer byte.
  BUF_MEM *b = reinterpret_cast<BUF_MEM *>(bio->ptr);
  int ret = size - 1;
  if ((size_t)ret > b->length) {
    ret = (int)b->length;
  }

  // Stop at the first newline.
  const char *newline =
      reinterpret_cast<char *>(OPENSSL_memchr(b->data, '\n', ret));
  if (newline != NULL) {
    ret = (int)(newline - b->data + 1);
  }

  ret = mem_read(bio, buf, ret);
  if (ret >= 0) {
    buf[ret] = '\0';
  }
  return ret;
}